

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalJacobianContIntDamping
          (ChElementBeamANCF_3333 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ChVectorN<double,_6> *scalar;
  double *scalar_00;
  double *scalar_01;
  double *other;
  double *other_00;
  Matrix<double,__1,__1,_1,__1,__1> *xpr;
  long col;
  long row;
  long row_00;
  long col_00;
  long col_01;
  double *scalar_02;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar2;
  PointerType pdVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [32];
  scalar_constant_op<double> sVar8;
  LhsNested LVar9;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *this_00;
  undefined1 *puVar10;
  Scalar *pSVar11;
  Scalar *pSVar12;
  long lVar13;
  int i;
  Index IVar14;
  long lVar15;
  double *other_01;
  int i_1;
  long lVar16;
  Scalar SVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint j;
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict1 ScaledMassMatrix;
  VectorNIP_D0 E_BlockDamping_D0;
  VectorNIP_Dv E_BlockDamping_Dv;
  VectorNIP_D0 SPK2_1_Block_D0;
  VectorNIP_Dv E3_Block_Dv;
  ChMatrixNM<double,_3_*_NSF,_3_*_NIP_Dv>_conflict Scaled_Combined_PE_Dv;
  VectorNIP_Dv SPK2_3_Block_Dv;
  VectorNIP_Dv SPK2_2_Block_Dv;
  VectorNIP_Dv SPK2_1_Block_Dv;
  VectorNIP_Dv E2_Block_Dv;
  VectorNIP_Dv E1_Block_Dv;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict1 S_scaled_SD;
  VectorNIP_D0 SPK2_4_Block_D0;
  VectorNIP_D0 SPK2_3_Block_D0;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  VectorNIP_D0 SPK2_5_Block_D0;
  VectorNIP_D0 SPK2_6_Block_D0;
  VectorNIP_D0 SPK2_2_Block_D0;
  ChMatrixNM<double,_3_*_NSF,_6_*_NIP_D0___3_*_NIP_Dv>_conflict DScaled_Combined_PE;
  MatrixNx6 ebar_ebardot;
  ChMatrixNM<double,_3_*_NSF,_6_*_NIP_D0___3_*_NIP_Dv>_conflict PE;
  Index local_b370;
  undefined1 local_b300 [16];
  scalar_constant_op<double> sStack_b2f0;
  scalar_constant_op<double> sStack_b2e8;
  variable_if_dynamic<long,__1> vStack_b2e0;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_b2d8;
  variable_if_dynamic<long,__1> vStack_b2d0;
  variable_if_dynamic<long,__1> vStack_b2c8;
  variable_if_dynamic<long,__1> vStack_b2c0;
  undefined1 local_b260 [16];
  LhsNested LStack_b250;
  variable_if_dynamic<long,__1> vStack_b248;
  variable_if_dynamic<long,__1> vStack_b240;
  element_type *peStack_b238;
  variable_if_dynamic<long,__1> vStack_b230;
  variable_if_dynamic<long,__1> vStack_b228;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_b220;
  RhsNested local_b218;
  LhsNested local_b210;
  PointerType pdStack_b208;
  double dStack_b200;
  Matrix<double,__1,__1,_0,__1,__1> *local_b1f8;
  variable_if_dynamic<long,__1> vStack_b1f0;
  variable_if_dynamic<long,__1> vStack_b1e8;
  double dStack_b1e0;
  LhsNested local_b1c8;
  PointerType pdStack_b1c0;
  double dStack_b1b8;
  Matrix<double,__1,__1,_0,__1,__1> *local_b1b0;
  variable_if_dynamic<long,__1> vStack_b1a8;
  variable_if_dynamic<long,__1> vStack_b1a0;
  double dStack_b198;
  undefined1 local_b0e0 [16];
  scalar_constant_op<double> sStack_b0d0;
  variable_if_dynamic<long,__1> vStack_b0c8;
  variable_if_dynamic<long,__1> vStack_b0c0;
  XprTypeNested pMStack_b0b8;
  variable_if_dynamic<long,__1> vStack_b0b0;
  variable_if_dynamic<long,__1> vStack_b0a8;
  double dStack_b0a0;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_b070;
  double local_b068;
  undefined1 local_b060 [16];
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_b050;
  variable_if_dynamic<long,__1> vStack_b048;
  variable_if_dynamic<long,__1> vStack_b040;
  double dStack_b038;
  undefined1 local_b030 [16];
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_b020;
  variable_if_dynamic<long,__1> vStack_b018;
  variable_if_dynamic<long,__1> vStack_b010;
  double dStack_b008;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_b000 [24];
  double local_afe8;
  PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> local_afe0 [8];
  double local_afd8;
  double local_afd0;
  double local_afc8;
  double local_afc0;
  double local_afb8;
  double local_afb0;
  double local_afa8;
  double local_afa0;
  undefined1 local_af98 [16];
  scalar_constant_op<double> sStack_af88;
  variable_if_dynamic<long,__1> vStack_af80;
  variable_if_dynamic<long,__1> vStack_af78;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_af70;
  undefined1 local_af60 [96];
  undefined1 local_af00 [16];
  scalar_constant_op<double> sStack_aef0;
  scalar_constant_op<double> sStack_aee8;
  variable_if_dynamic<long,__1> vStack_aee0;
  double dStack_aed8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_ae98 [24];
  undefined1 local_ae80 [48];
  variable_if_dynamic<long,__1> vStack_ae50;
  variable_if_dynamic<long,__1> vStack_ae48;
  undefined1 *puStack_ae40;
  undefined1 *local_ae38;
  double dStack_ae30;
  double local_ae28;
  double local_ae20;
  PointerType pdStack_ae10;
  double dStack_ae08;
  XprTypeNested local_ae00;
  double dStack_adf8;
  double dStack_adf0;
  XprTypeNested pMStack_ade8;
  undefined1 *local_ade0;
  undefined1 *local_add0;
  double local_adc8;
  double local_adc0;
  double local_adb8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_a6d0 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_a6b8 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_a6a0 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_a688 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_a670 [24];
  undefined1 local_a658 [1080];
  Matrix<double,_9,_45,_1,_9,_45> local_a220;
  Matrix<double,_12,_1,_0,_12,_1> local_9560;
  Matrix<double,_12,_1,_0,_12,_1> local_9500;
  undefined1 local_9490 [192];
  undefined1 local_93d0 [888];
  undefined1 local_9058 [192];
  undefined1 local_8f98 [96];
  undefined1 local_8f38 [24];
  undefined1 local_8f20 [24];
  undefined1 local_8f08 [24];
  undefined1 local_8ef0 [96];
  undefined1 local_8e90 [96];
  undefined1 local_8e30 [96];
  undefined1 local_8dd0 [24];
  undefined1 local_8db8 [24];
  undefined1 local_8da0 [24];
  undefined1 local_8d88 [96];
  undefined1 local_8d28 [96];
  undefined1 local_8cc8 [96];
  undefined1 local_8c68 [24];
  undefined1 local_8c50 [24];
  undefined1 local_8c38 [24];
  undefined1 local_8c20 [160];
  undefined1 local_8b80 [96];
  Matrix<double,_12,_1,_0,_12,_1> local_8b20;
  Matrix<double,_27,_81,_1,_27,_81> local_8ac0;
  MatrixBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_> local_4660 [432];
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_9,_6,_1,_9,_6>,_0>
  local_44b0;
  
  local_b070 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                *)H;
  local_b068 = Kfactor;
  local_afe8 = Mfactor;
  CalcCombinedCoordMatrix(this,(MatrixNx6 *)local_4660);
  xpr = &this->m_SD;
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [0] = (double)xpr;
  local_44b0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                          &local_8ac0,local_4660);
  Eigen::PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,9,6,1,9,6>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_9490,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_9,_6,_1,_9,_6>,_0>_>
              *)&local_44b0);
  IVar14 = 0;
  for (lVar13 = 0; dVar6 = local_b068, lVar13 != 9; lVar13 = lVar13 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = SUB168(ZEXT816(0),4);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage
               .m_data.array[6];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0xc);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_9490 + 0x60);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0x18);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)local_93d0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0x18);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0xc);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)(local_9490 + 0x60);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)local_93d0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0x18);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = SUB168(ZEXT816(0),4);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)local_93d0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage
               .m_data.array[7];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0xc);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = SUB168(ZEXT816(0),4);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_9490 + 0x60);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage
               .m_data.array[7];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x24);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x60);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.77863632502849e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0x48);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x27);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x78);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.92685601878086e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0x4b);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x2a);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x90);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 2.07507571253324e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,IVar14,0x4e);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0xa8);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    lVar16 = IVar14 + 1;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0xc);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x108);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0x18);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x168);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0x18);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0xc);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)(local_93d0 + 0x108);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_93d0 + 0x168);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0x18);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)(local_93d0 + 0xa8);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_93d0 + 0x168);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0xc);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)(local_93d0 + 0xa8);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_93d0 + 0x108);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x24);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x1c8);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.77863632502849e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x48);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x27);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x1e0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.92685601878086e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x4b);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x2a);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x1f8);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 2.07507571253324e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x4e);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x210);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    lVar16 = IVar14 + 2;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0xc);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x270);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_a220,xpr,
               lVar13,0x18);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x2d0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0x18);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0xc);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)(local_93d0 + 0x270);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_93d0 + 0x2d0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0x18);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)(local_93d0 + 0x210);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_93d0 + 0x2d0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_ae80,xpr,
               lVar13,0xc);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)local_ae80._32_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)local_ae80._40_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_ae80._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_ae80._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)local_ae80._16_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)local_ae80._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a658,xpr,
               lVar13,0);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[7] = (double)(local_93d0 + 0x210);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_a658._32_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_a658._40_8_;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_93d0 + 0x270);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x17] = 5.92878775009496e-323;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = (double)local_9490;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0x16] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b260,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x24);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x330);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.77863632502849e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x48);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x27);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x348);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 1.92685601878086e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x4b);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_a220,xpr,
               lVar13,0x2a);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[6] = (double)(local_93d0 + 0x360);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[9] = 2.07507571253324e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[8] = (double)local_9490;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (Matrix<double,_27,_81,_1,_27,_81> *)&local_44b0,lVar16,0x4e);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_3,_false> *)local_ae80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_8ac0);
    IVar14 = IVar14 + 3;
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_b068;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = Rfactor;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->m_Alpha;
  auVar5 = vfmadd132sd_fma(auVar18,auVar19,auVar5);
  scalar_02 = &this->m_Alpha;
  local_b0e0._0_8_ = auVar5._0_8_;
  vStack_b248.m_value = 0;
  vStack_b240.m_value = 0;
  peStack_b238 = (element_type *)0x2d;
  local_b260._0_8_ = (element_type *)local_9490;
  LStack_b250.m_matrix = (non_const_type)local_9490;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>
                    *)&local_a220,(double *)local_b0e0,(StorageBaseType *)local_b260);
  local_b300._0_8_ = local_9058;
  local_af60._0_8_ = dVar6 * this->m_Alpha;
  sStack_b2e8.m_other = 0.0;
  vStack_b2e0.m_value = 3;
  pMStack_b2d8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x2d;
  sStack_b2f0.m_other = (double)local_9490;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>
                    *)local_ae80,(double *)local_af60,(StorageBaseType *)local_b300);
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[2];
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[3];
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[4];
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [6] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[5];
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [7] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[6];
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [8] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[7];
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [9] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[8];
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [0xd] = (double)local_ae80._16_8_;
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [0x12] = (double)vStack_ae48.m_value;
  local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.array
  [0x13] = (double)puStack_ae40;
  Eigen::PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,45,3,0,45,3>const>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,45,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,45,3,0,45,3>const>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,45,3,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_a658,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>_>_>
              *)&local_8ac0);
  pMVar1 = &this->m_kGQ_D0;
  pMVar2 = &this->m_kGQ_Dv;
  lVar13 = 0;
  while( true ) {
    if (lVar13 == 3) break;
    local_ae80._0_8_ = pMVar1;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)&local_a220,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_a658,0,lVar13);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>
                *)&local_8ac0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_ae80);
    local_ae80._0_8_ = pMVar1;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)&local_a220,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_a658,0xc,lVar13);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>
                *)&local_8ac0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_ae80);
    local_ae80._0_8_ = pMVar1;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)&local_a220,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_a658,0x18,lVar13);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>
                *)&local_8ac0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_ae80);
    local_ae80._0_8_ = pMVar2;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)&local_a220,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_a658,0x24,lVar13);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
    ::operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
                  *)&local_8ac0,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 local_ae80);
    local_ae80._0_8_ = pMVar2;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)&local_a220,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_a658,0x27,lVar13);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
    ::operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
                  *)&local_8ac0,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 local_ae80);
    local_ae80._0_8_ = pMVar2;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)&local_a220,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_a658,0x2a,lVar13);
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[4] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[4];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[5] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[5];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[0] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[0];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[1] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[1];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[2] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[2];
    local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
    array[3] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
               m_data.array[3];
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
    ::operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
                  *)&local_8ac0,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 local_ae80);
    lVar13 = lVar13 + 1;
  }
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)
             &local_8ac0,
             &(this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>);
  dVar6 = local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.
          m_data.array[0];
  scalar = (ChVectorN<double,_6> *)
           ((long)local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.
                  m_storage.m_data.array[0] + 0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.
              m_data.array + 1));
  scalar_00 = (((ChVectorN<double,_6> *)((long)dVar6 + 0x10))->
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
              2;
  scalar_01 = (((ChVectorN<double,_6> *)((long)dVar6 + 0x10))->
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
              1;
  other = (((ChVectorN<double,_6> *)((long)dVar6 + 0x10))->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array + 3;
  IVar14 = 0;
  lVar13 = 0;
  other_00 = (((ChVectorN<double,_6> *)((long)dVar6 + 0x10))->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
             4;
  other_01 = (((ChVectorN<double,_6> *)((long)dVar6 + 0x10))->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
             5;
  while( true ) {
    if (lVar13 == 9) break;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0);
    auVar7 = stack0xffffffffffff5198;
    puStack_ae40 = local_a658;
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    vStack_ae50.m_value = auVar7._24_8_;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    local_ae38 = (undefined1 *)0x0;
    dStack_ae30 = SUB168(ZEXT816(0),4);
    local_ae28 = 2.22329540628561e-322;
    vStack_ae50.m_value = (long)puStack_ae40;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,(double *)scalar,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,IVar14,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0xc);
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    local_ae38 = (undefined1 *)0xc;
    dStack_ae30 = 0.0;
    local_ae28 = 2.22329540628561e-322;
    puStack_ae40 = local_a658;
    vStack_ae50.m_value = (long)(local_a658 + 0x60);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,scalar_01,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,IVar14,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0x18);
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    vStack_ae50.m_value = (long)(local_a658 + 0xc0);
    local_ae38 = (undefined1 *)0x18;
    dStack_ae30 = 0.0;
    local_ae28 = 2.22329540628561e-322;
    puStack_ae40 = local_a658;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,scalar_00,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,IVar14,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0x18);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0xc);
    vStack_ae48.m_value = (long)(local_a658 + 0x60);
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    local_ae38 = local_a658;
    dStack_ae30 = 5.92878775009496e-323;
    local_ae28 = 0.0;
    local_ade0 = local_a658 + 0xc0;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 1.18575755001899e-322;
    local_adc0 = 0.0;
    local_adb8 = 2.22329540628561e-322;
    local_add0 = local_ae38;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,IVar14,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0x18);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0);
    vStack_ae48.m_value = (long)local_a658;
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    dStack_ae30 = 0.0;
    local_ae28 = SUB168(ZEXT816(0),4);
    local_ade0 = local_a658 + 0xc0;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 1.18575755001899e-322;
    local_adc0 = 0.0;
    local_adb8 = 2.22329540628561e-322;
    local_ae38 = (undefined1 *)vStack_ae48.m_value;
    local_add0 = (undefined1 *)vStack_ae48.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other_00,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,IVar14,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0xc);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0);
    local_ade0 = local_a658 + 0x60;
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    dStack_ae30 = 0.0;
    local_ae28 = SUB168(ZEXT816(0),4);
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 5.92878775009496e-323;
    local_adc0 = 0.0;
    local_adb8 = 2.22329540628561e-322;
    vStack_ae48.m_value = (long)local_a658;
    local_ae38 = local_a658;
    local_add0 = local_a658;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other_01,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,IVar14,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0);
    auVar7 = stack0xffffffffffff5198;
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    vStack_ae50.m_value = auVar7._24_8_;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    local_ae38 = (undefined1 *)0x0;
    dStack_ae30 = 4.94065645841247e-324;
    local_ae28 = 2.22329540628561e-322;
    puStack_ae40 = local_a658;
    vStack_ae50.m_value = (long)(local_a658 + 0x168);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,(double *)scalar,(StorageBaseType *)local_ae80);
    lVar16 = IVar14 + 1;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,lVar16,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0xc);
    puStack_ae40 = local_a658;
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    local_ae38 = (undefined1 *)0xc;
    dStack_ae30 = 4.94065645841247e-324;
    local_ae28 = 2.22329540628561e-322;
    vStack_ae50.m_value = (long)(local_a658 + 0x1c8);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,scalar_01,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,lVar16,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0x18);
    puStack_ae40 = local_a658;
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    vStack_ae50.m_value = (long)(local_a658 + 0x228);
    local_ae38 = (undefined1 *)0x18;
    dStack_ae30 = 4.94065645841247e-324;
    local_ae28 = 2.22329540628561e-322;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,scalar_00,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,lVar16,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0x18);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0xc);
    vStack_ae48.m_value = (long)(local_a658 + 0x1c8);
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    local_ae38 = local_a658;
    dStack_ae30 = 5.92878775009496e-323;
    local_ae28 = 4.94065645841247e-324;
    local_ade0 = local_a658 + 0x228;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 1.18575755001899e-322;
    local_adc0 = 4.94065645841247e-324;
    local_adb8 = 2.22329540628561e-322;
    local_add0 = local_ae38;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,lVar16,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0x18);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0);
    vStack_ae48.m_value = (long)(local_a658 + 0x168);
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    local_ae38 = local_a658;
    dStack_ae30 = 0.0;
    local_ae28 = 4.94065645841247e-324;
    local_ade0 = local_a658 + 0x228;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 1.18575755001899e-322;
    local_adc0 = 4.94065645841247e-324;
    local_adb8 = 2.22329540628561e-322;
    local_add0 = local_ae38;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other_00,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,lVar16,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0xc);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0);
    vStack_ae48.m_value = (long)(local_a658 + 0x168);
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    local_ae38 = local_a658;
    dStack_ae30 = 0.0;
    local_ae28 = 4.94065645841247e-324;
    local_ade0 = local_a658 + 0x1c8;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 5.92878775009496e-323;
    local_adc0 = 4.94065645841247e-324;
    local_adb8 = 2.22329540628561e-322;
    local_add0 = local_ae38;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other_01,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,lVar16,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0);
    auVar7 = stack0xffffffffffff5198;
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    vStack_ae50.m_value = auVar7._24_8_;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    local_ae38 = (undefined1 *)0x0;
    dStack_ae30 = 9.88131291682493e-324;
    local_ae28 = 2.22329540628561e-322;
    puStack_ae40 = local_a658;
    vStack_ae50.m_value = (long)(local_a658 + 0x2d0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,(double *)scalar,(StorageBaseType *)local_ae80);
    lVar16 = IVar14 + 2;
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,lVar16,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0xc);
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    local_ae38 = (undefined1 *)0xc;
    dStack_ae30 = 9.88131291682493e-324;
    local_ae28 = 2.22329540628561e-322;
    puStack_ae40 = local_a658;
    vStack_ae50.m_value = (long)(local_a658 + 0x330);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,scalar_01,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,lVar16,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b260,xpr,
               lVar13,0x18);
    puStack_ae40 = local_a658;
    local_ae80._32_8_ = vStack_b240.m_value;
    local_ae80._24_8_ = vStack_b248.m_value;
    local_ae80._40_8_ = peStack_b238;
    local_ae80._0_8_ = local_b260._0_8_;
    local_ae80._8_8_ = local_b260._8_8_;
    local_ae80._16_8_ = LStack_b250.m_matrix;
    vStack_ae50.m_value = (long)(local_a658 + 0x390);
    local_ae38 = (undefined1 *)0x18;
    dStack_ae30 = 9.88131291682493e-324;
    local_ae28 = 2.22329540628561e-322;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_a220,scalar_00,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               &local_8ac0,lVar16,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0x18);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0xc);
    vStack_ae48.m_value = (long)(local_a658 + 0x330);
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    local_ae38 = local_a658;
    dStack_ae30 = 5.92878775009496e-323;
    local_ae28 = 9.88131291682493e-324;
    local_ade0 = local_a658 + 0x390;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 1.18575755001899e-322;
    local_adc0 = 9.88131291682493e-324;
    local_adb8 = 2.22329540628561e-322;
    local_add0 = local_ae38;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,lVar16,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0x18);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0);
    vStack_ae48.m_value = (long)(local_a658 + 0x2d0);
    local_ae38 = local_a658;
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    local_ae80._40_8_ = vStack_b240.m_value;
    vStack_ae50.m_value = (long)peStack_b238;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    dStack_ae30 = 0.0;
    local_ae28 = 9.88131291682493e-324;
    local_ade0 = local_a658 + 0x390;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 1.18575755001899e-322;
    local_adc0 = 9.88131291682493e-324;
    local_adb8 = 2.22329540628561e-322;
    local_add0 = local_ae38;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other_00,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,lVar16,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b300,xpr,
               lVar13,0xc);
    vStack_b240.m_value = vStack_b2e0.m_value;
    peStack_b238 = (element_type *)pMStack_b2d8;
    local_b260._0_8_ = local_b300._0_8_;
    local_b260._8_8_ = local_b300._8_8_;
    LStack_b250.m_matrix = (non_const_type)sStack_b2f0.m_other;
    vStack_b248.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b0e0,xpr,
               lVar13,0);
    auVar7._8_8_ = vStack_b248.m_value;
    auVar7._0_8_ = LStack_b250.m_matrix;
    auVar7._16_8_ = vStack_b240.m_value;
    auVar7._24_8_ = peStack_b238;
    vStack_ae48.m_value = (long)(local_a658 + 0x2d0);
    local_ae38 = local_a658;
    dStack_adf0 = (double)vStack_b0c0.m_value;
    pMStack_ade8 = pMStack_b0b8;
    pdStack_ae10 = (PointerType)local_b0e0._0_8_;
    dStack_ae08 = (double)local_b0e0._8_8_;
    local_ae00 = (XprTypeNested)sStack_b0d0.m_other;
    dStack_adf8 = (double)vStack_b0c8.m_value;
    local_ae80._8_8_ = local_b260._0_8_;
    local_ae80._16_8_ = local_b260._8_8_;
    stack0xffffffffffff51a8 = auVar7._16_16_;
    local_ae80._32_8_ = vStack_b248.m_value;
    local_ae80._24_8_ = LStack_b250.m_matrix;
    dStack_ae30 = 0.0;
    local_ae28 = 9.88131291682493e-324;
    local_ade0 = local_a658 + 0x330;
    local_ae20 = 2.22329540628561e-322;
    local_adc8 = 5.92878775009496e-323;
    local_adc0 = 9.88131291682493e-324;
    local_adb8 = 2.22329540628561e-322;
    local_add0 = local_ae38;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_a220,other_01,(StorageBaseType *)local_ae80);
    Eigen::Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               &local_8ac0,lVar16,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_1,_12,_false> *)local_af60,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_a220);
    IVar14 = IVar14 + 3;
    lVar13 = lVar13 + 1;
  }
  IVar14 = 0;
  lVar13 = 0;
  while( true ) {
    if (lVar13 == 9) break;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x24);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x120);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 1.77863632502849e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 0.0;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,IVar14,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x27);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x138);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 1.92685601878086e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 0.0;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,IVar14,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x2a);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x150);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 2.07507571253324e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 0.0;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,IVar14,6);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x24);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x288);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 1.77863632502849e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 4.94065645841247e-324;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    lVar16 = IVar14 + 1;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,lVar16,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x27);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x2a0);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 1.92685601878086e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 4.94065645841247e-324;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,lVar16,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x2a);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x2b8);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 2.07507571253324e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 4.94065645841247e-324;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,lVar16,6);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x24);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x3f0);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 1.77863632502849e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 9.88131291682493e-324;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    lVar16 = IVar14 + 2;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,lVar16,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x27);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x408);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 1.92685601878086e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 9.88131291682493e-324;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,lVar16,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b260,xpr,lVar13
               ,0x2a);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [6] = (double)(local_a658 + 0x420);
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [8] = (double)local_a658;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_b240.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_b238;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0] = (double)local_b260._0_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [1] = (double)local_b260._8_8_;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_b250.m_matrix;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_b248.m_value;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [9] = 2.07507571253324e-322;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [10] = 9.88131291682493e-324;
    local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (Matrix<double,_27,_9,_1,_27,_9> *)local_ae80,lVar16,6);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_1,_3,_false> *)local_b300,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_a220);
    lVar13 = lVar13 + 1;
    IVar14 = IVar14 + 3;
  }
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)
             &local_a220,
             &(this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Matrix<double,3,3,1,3,3>>
            (local_afe0,
             (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
             ((long)local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.
                    m_storage.m_data.array[0] + 0x40));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
              m_data.array + 1));
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 0.0;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)local_ae80;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_ae80;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b260,(double *)local_afe0,(StorageBaseType *)&local_9500);
  puVar10 = local_ae80 + 0x18;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)puVar10;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_ae80;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b300,&local_afd8,(StorageBaseType *)&local_9560);
  LVar9.m_matrix = LStack_b250.m_matrix;
  sVar8.m_other = sStack_b2f0.m_other;
  local_8c20._0_8_ = &vStack_ae50;
  local_8c20._16_8_ = local_ae80;
  local_8c20._24_8_ = 0.0;
  local_af60._0_8_ = vStack_b248.m_value;
  local_af60._8_8_ = vStack_b240.m_value;
  local_af60._16_8_ = peStack_b238;
  local_af60._24_8_ = vStack_b230.m_value;
  local_af60._32_8_ = vStack_b228.m_value;
  local_af60._40_8_ = pMStack_b220;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = sStack_b2e8.m_other;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_b2e0.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_b2d8;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_b2d0.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_b2c8.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = (double)vStack_b2c0.m_value;
  local_8c20._32_8_ = 2.96439387504748e-323;
  local_8c20._40_8_ = 4.44659081257122e-323;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b0e0,&local_afd0,(StorageBaseType *)local_8c20);
  local_8b80._0_8_ =
       local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
       array + 0x48;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)LVar9.m_matrix;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = (double)local_af60._0_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = (double)local_af60._8_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = (double)local_af60._16_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_af60._24_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [9] = (double)local_af60._32_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_af60._40_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xe] = sVar8.m_other;
  local_8b80._16_8_ = &local_8ac0;
  local_8b80._24_8_ = 0;
  local_8b80._32_8_ = 0x48;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
          .array[0];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x10] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[1];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[3];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[4];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[5];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = sStack_b0d0.m_other;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = (double)vStack_b0c8.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1b] = (double)vStack_b0c0.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1c] = (double)pMStack_b0b8;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)vStack_b0b0.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1e] = (double)vStack_b0a8.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = dStack_b0a0;
  local_8b80._40_8_ = 4.0019317313141e-322;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,27,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const>>
            ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_27,_3,_false> *)local_8b80,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>_>
              *)&local_a220);
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)local_ae80;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 0.0;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
        array[0];
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b260,&local_afc8,(StorageBaseType *)&local_9500);
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_ae80;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)puVar10;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b300,&local_afc0,(StorageBaseType *)&local_9560);
  LVar9.m_matrix = LStack_b250.m_matrix;
  sVar8.m_other = sStack_b2f0.m_other;
  local_8c20._0_8_ = &vStack_ae50;
  local_8c20._16_8_ = local_ae80;
  local_8c20._24_8_ = 0.0;
  local_af60._0_8_ = vStack_b248.m_value;
  local_af60._8_8_ = vStack_b240.m_value;
  local_af60._16_8_ = peStack_b238;
  local_af60._24_8_ = vStack_b230.m_value;
  local_af60._32_8_ = vStack_b228.m_value;
  local_af60._40_8_ = pMStack_b220;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = sStack_b2e8.m_other;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_b2e0.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_b2d8;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_b2d0.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_b2c8.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = (double)vStack_b2c0.m_value;
  local_8c20._32_8_ = 2.96439387504748e-323;
  local_8c20._40_8_ = 4.44659081257122e-323;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b0e0,&local_afb8,(StorageBaseType *)local_8c20);
  local_8b80._0_8_ =
       local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
       array + 0x4b;
  local_8b80._16_8_ = &local_8ac0;
  local_8b80._24_8_ = 0;
  local_8b80._32_8_ = 0x4b;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)LVar9.m_matrix;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = (double)local_af60._0_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = (double)local_af60._8_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = (double)local_af60._16_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_af60._24_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [9] = (double)local_af60._32_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_af60._40_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xe] = sVar8.m_other;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
          .array[0];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x10] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[1];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[3];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[4];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[5];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = sStack_b0d0.m_other;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = (double)vStack_b0c8.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1b] = (double)vStack_b0c0.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1c] = (double)pMStack_b0b8;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)vStack_b0b0.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1e] = (double)vStack_b0a8.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = dStack_b0a0;
  local_8b80._40_8_ = 4.0019317313141e-322;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,27,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const>>
            ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_27,_3,_false> *)local_8b80,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>_>
              *)&local_a220);
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 0.0;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)local_ae80;
  local_9500.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_ae80;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b260,&local_afb0,(StorageBaseType *)&local_9500);
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)puVar10;
  local_9560.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_ae80;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b300,&local_afa8,(StorageBaseType *)&local_9560);
  LVar9.m_matrix = LStack_b250.m_matrix;
  sVar8.m_other = sStack_b2f0.m_other;
  local_8c20._0_8_ = &vStack_ae50;
  local_8c20._16_8_ = local_ae80;
  local_8c20._24_8_ = 0.0;
  local_af60._0_8_ = vStack_b248.m_value;
  local_af60._8_8_ = vStack_b240.m_value;
  local_af60._16_8_ = peStack_b238;
  local_af60._24_8_ = vStack_b230.m_value;
  local_af60._32_8_ = vStack_b228.m_value;
  local_af60._40_8_ = pMStack_b220;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = sStack_b2e8.m_other;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_b2e0.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_b2d8;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_b2d0.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_b2c8.m_value;
  local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = (double)vStack_b2c0.m_value;
  local_8c20._32_8_ = 2.96439387504748e-323;
  local_8c20._40_8_ = 4.44659081257122e-323;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>
                    *)local_b0e0,&local_afa0,(StorageBaseType *)local_8c20);
  local_8b80._0_8_ =
       local_8ac0.super_PlainObjectBase<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>.m_storage.m_data.
       array + 0x4e;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)LVar9.m_matrix;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = (double)local_af60._0_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = (double)local_af60._8_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = (double)local_af60._16_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_af60._24_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [9] = (double)local_af60._32_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_af60._40_8_;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xe] = sVar8.m_other;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
          .array[0];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x10] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[1];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[3];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[4];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = local_8b20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[5];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = sStack_b0d0.m_other;
  local_8b80._24_8_ = 0;
  local_8b80._32_8_ = 0x4e;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = (double)vStack_b0c8.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1b] = (double)vStack_b0c0.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1c] = (double)pMStack_b0b8;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)vStack_b0b0.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1e] = (double)vStack_b0a8.m_value;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = dStack_b0a0;
  local_8b80._40_8_ = 4.0019317313141e-322;
  local_8b80._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_8ac0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,27,81,1,27,81>,27,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,27,3,1,27,3>const>const,Eigen::Block<Eigen::Matrix<double,27,9,1,27,9>,27,3,false>const>const>>
            ((Block<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_27,_3,_false> *)local_8b80,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_27,_3,_1,_27,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_27,_9,_1,_27,_9>,_27,_3,_false>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)&local_44b0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [1] = (double)&local_8ac0;
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::Product<Eigen::Matrix<double,27,81,1,27,81>,Eigen::Transpose<Eigen::Matrix<double,27,81,1,27,81>>,0>>
            ((Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)local_b070
             ,(Product<Eigen::Matrix<double,_27,_81,_1,_27,_81>,_Eigen::Transpose<Eigen::Matrix<double,_27,_81,_1,_27,_81>_>,_0>
               *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_8ef0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_8d88;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_9058;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 0.0;
  pdVar3 = (PointerType)(local_93d0 + 0xa8);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 0.0;
  puVar10 = local_93d0 + 0x210;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_b0e0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_af60,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_af60;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_b260,
             (Scalar *)&local_a220);
  local_b260._0_8_ = *scalar_02 + *scalar_02;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_a220,(double *)local_b260,(StorageBaseType *)local_b0e0);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_af60,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_af60;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (scalar->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
        array[0] * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_af60,(Scalar *)&local_a220)
  ;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_9490 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)(local_9058 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_8e90;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_8d28;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  pdVar3 = (PointerType)(local_93d0 + 0x108);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_93d0 + 0x270);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_b260._0_8_ = local_b0e0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_b260,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_9490 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_93d0 + 0x270);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0x1d];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8b20,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8b20;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_b260,
             (Scalar *)&local_a220);
  local_b260._0_8_ = *scalar_02 + *scalar_02;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_a220,(double *)local_b260,(StorageBaseType *)local_b0e0);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8b20,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8b20;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = *scalar_01 * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)&local_8b20,(Scalar *)&local_a220
            );
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)local_93d0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_8f98;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_8e30;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_8cc8;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  pdVar3 = (PointerType)(local_93d0 + 0x168);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_93d0 + 0x2d0);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_b260._0_8_ = local_b0e0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_b260,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)local_93d0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_93d0 + 0x2d0);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.
           m_data.array[0x1d];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_9500,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_9500;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_b260,
             (Scalar *)&local_a220);
  local_b260._0_8_ = *scalar_02 + *scalar_02;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_a220,(double *)local_b260,(StorageBaseType *)local_b0e0);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_9500,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_9500;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = *scalar_00 * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)&local_9500,(Scalar *)&local_a220
            );
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = (double)local_93d0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [9] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = (double)(local_9058 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xe] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = (double)(local_93d0 + 0x168);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = (double)local_8e90;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1b] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = (double)(local_93d0 + 0x2d0);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = (double)local_8d28;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x29] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2e] = (double)(local_9490 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x34] = (double)local_8f98;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x31] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x37] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x42] = (double)local_8e30;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3f] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_b260._0_8_ = local_b0e0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4a] = (double)(local_93d0 + 0x270);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x45] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x50] = (double)local_8cc8;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4d] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x53] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x30] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x36] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3c] = (double)(local_93d0 + 0x108);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3e] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x44] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4c] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x52] = (double)local_9490;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_b260,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_9490 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_93d0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_93d0 + 0x270);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)(local_93d0 + 0x2d0);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)(local_93d0 + 0x108);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)(local_93d0 + 0x168);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_9560,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_a220,scalar_02,(StorageBaseType *)local_b0e0);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_9560,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_9560;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)&local_9560,other);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = (double)local_93d0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = (double)local_9058;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [9] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = (double)local_8ef0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = (double)(local_93d0 + 0x2d0);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = (double)local_8d88;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x34] = (double)local_8f98;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3c] = (double)(local_93d0 + 0xa8);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x31] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x42] = (double)local_8e30;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x37] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3f] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x50] = (double)local_8cc8;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x45] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4d] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x53] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_b260._0_8_ = local_b0e0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = (double)(local_93d0 + 0x168);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2e] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x30] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x36] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3e] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x44] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4a] = (double)(local_93d0 + 0x210);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4c] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x52] = (double)local_9490;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_b260,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_93d0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)(local_93d0 + 0xa8);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)(local_93d0 + 0x168);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)(local_93d0 + 0x2d0);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_93d0 + 0x210);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_8c20,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_a220,scalar_02,(StorageBaseType *)local_b0e0);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_8c20,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_8c20;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_8c20,other_00);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = (double)(local_9490 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = (double)local_9058;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [9] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = (double)(local_93d0 + 0x108);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = (double)local_8ef0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = (double)(local_93d0 + 0x270);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = (double)local_8d88;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x34] = (double)(local_9058 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3c] = (double)(local_93d0 + 0xa8);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x31] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x42] = (double)local_8e90;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x37] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3f] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x50] = (double)local_8d28;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x45] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4a] = (double)(local_93d0 + 0x210);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4d] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x53] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_b260._0_8_ = (StorageBaseType *)local_b0e0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x2e] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x30] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x36] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x3e] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x44] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x4c] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x52] = (double)local_9490;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_b260,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)(local_9490 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)(local_93d0 + 0xa8);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)(local_93d0 + 0x108);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_93d0 + 0x210);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)(local_93d0 + 0x270);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_8b80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_a220,scalar_02,(StorageBaseType *)local_b0e0);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_8b80,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_8b80;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_8b80,other_01);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_93d0 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_8f38;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_8dd0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.77863632502849e-322;
  pdVar3 = (PointerType)(local_93d0 + 0x1c8);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_8c68;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.77863632502849e-322;
  puVar10 = local_93d0 + 0x330;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_b000,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_93d0 + 0x60);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.77863632502849e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_a670,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_b260._0_8_ = local_a670;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_b260,
             (Scalar *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a670,(Scalar *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&local_a220,scalar_02,(StorageBaseType *)local_b000);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_a670,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = local_a670;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar2;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_93d0 + 0x78);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_8f20;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_8db8;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.92685601878086e-322;
  pdVar3 = (PointerType)(local_93d0 + 0x1e0);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_8c50;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.92685601878086e-322;
  puVar10 = local_93d0 + 0x348;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_b260._0_8_ = local_b000;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_b260,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_93d0 + 0x78);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 1.92685601878086e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_a688,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_b260._0_8_ = local_a688;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_b260,
             (Scalar *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a688,(Scalar *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&local_a220,scalar_02,(StorageBaseType *)local_b000);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_a688,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = local_a688;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar2;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_93d0 + 0x90);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = (double)local_8f08;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 2.07507571253324e-322;
  pdVar3 = (PointerType)(local_93d0 + 0x1f8);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_8da0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 2.07507571253324e-322;
  puVar10 = local_93d0 + 0x360;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_8c38;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_b260._0_8_ = local_b000;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_b260,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [2] = (double)(local_93d0 + 0x90);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [5] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xb] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x12] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x18] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x20] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x26] = 2.07507571253324e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [4] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [8] = local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.
        array[2];
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [10] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_9490;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar10;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_9490;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_ae98,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_b260._0_8_ = local_ae98;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_b260,
             (Scalar *)&local_a220);
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_ae98,(Scalar *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&local_a220,scalar_02,(StorageBaseType *)local_b000);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_ae98,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a220);
  local_b260._0_8_ = local_ae98;
  local_a220.super_PlainObjectBase<Eigen::Matrix<double,_9,_45,_1,_9,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar2;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_b260,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_b300,(double *)local_afe0,(StorageBaseType *)local_a670);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_af00,&local_afd8,(StorageBaseType *)local_a688);
  vStack_b248.m_value = (long)sStack_b2f0.m_other;
  vStack_b240.m_value = (long)sStack_b2e8.m_other;
  pMStack_b220 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_aef0.m_other;
  local_b218 = (RhsNested)sStack_aee8.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_af98,&local_afd0,(StorageBaseType *)local_ae98);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_a220,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_b260,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_af98);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_a6a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_b300,&local_afc8,(StorageBaseType *)local_a670);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_af00,&local_afc0,(StorageBaseType *)local_a688);
  vStack_b248.m_value = (long)sStack_b2f0.m_other;
  vStack_b240.m_value = (long)sStack_b2e8.m_other;
  pMStack_b220 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_aef0.m_other;
  local_b218 = (RhsNested)sStack_aee8.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_af98,&local_afb8,(StorageBaseType *)local_ae98);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_a220,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_b260,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_af98);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_a6b8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_a220);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_b300,&local_afb0,(StorageBaseType *)local_a670);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_af00,&local_afa8,(StorageBaseType *)local_a688);
  vStack_b248.m_value = (long)sStack_b2f0.m_other;
  vStack_b240.m_value = (long)sStack_b2e8.m_other;
  pMStack_b220 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_aef0.m_other;
  local_b218 = (RhsNested)sStack_aee8.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_af98,&local_afa0,(StorageBaseType *)local_ae98);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_a220,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_b260,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_af98);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_a6d0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_a220);
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_af98,xpr,
               lVar13,0);
    vStack_b2e0.m_value = vStack_af78.m_value;
    pMStack_b2d8 = pMStack_af70;
    local_b300._0_8_ = local_af98._0_8_;
    local_b300._8_8_ = local_af98._8_8_;
    sStack_b2f0.m_other = sStack_af88.m_other;
    sStack_b2e8.m_other = (double)vStack_af80.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b060,xpr,
               lVar13,0xc);
    vStack_aee0.m_value = vStack_b040.m_value;
    dStack_aed8 = dStack_b038;
    local_af00._0_8_ = local_b060._0_8_;
    local_af00._8_8_ = local_b060._8_8_;
    sStack_aef0.m_other = (double)pMStack_b050;
    sStack_aee8.m_other = (double)vStack_b048.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b030,xpr,
               lVar13,0x18);
    local_b1c8.m_matrix = (non_const_type)local_8c20;
    vStack_b1a0.m_value = vStack_b010.m_value;
    dStack_b198 = dStack_b008;
    pdStack_b1c0 = (PointerType)local_b030._0_8_;
    dStack_b1b8 = (double)local_b030._8_8_;
    local_b1b0 = pMStack_b020;
    vStack_b1a8.m_value = vStack_b018.m_value;
    LStack_b250.m_matrix = (non_const_type)local_af60;
    pMStack_b220 = pMStack_b2d8;
    vStack_b248.m_value = local_b300._0_8_;
    vStack_b240.m_value = local_b300._8_8_;
    peStack_b238 = (element_type *)sStack_b2f0.m_other;
    vStack_b230.m_value = (long)sStack_b2e8.m_other;
    vStack_b1e8.m_value = vStack_aee0.m_value;
    dStack_b1e0 = dStack_aed8;
    pdStack_b208 = (PointerType)local_af00._0_8_;
    dStack_b200 = (double)local_af00._8_8_;
    local_b1f8 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_aef0.m_other;
    vStack_b1f0.m_value = (long)sStack_aee8.m_other;
    local_b210.m_matrix = (non_const_type)local_8b80;
    Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false> *)(local_8c20 + 0x70),
               &local_a220,lVar13,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>>
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false> *)(local_8c20 + 0x70),
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>
                *)local_b260);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_af98,xpr,
               lVar13,0);
    vStack_b2e0.m_value = vStack_af78.m_value;
    pMStack_b2d8 = pMStack_af70;
    local_b300._0_8_ = local_af98._0_8_;
    local_b300._8_8_ = local_af98._8_8_;
    sStack_b2f0.m_other = sStack_af88.m_other;
    sStack_b2e8.m_other = (double)vStack_af80.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b060,xpr,
               lVar13,0xc);
    vStack_aee0.m_value = vStack_b040.m_value;
    dStack_aed8 = dStack_b038;
    local_af00._0_8_ = local_b060._0_8_;
    local_af00._8_8_ = local_b060._8_8_;
    sStack_aef0.m_other = (double)pMStack_b050;
    sStack_aee8.m_other = (double)vStack_b048.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b030,xpr,
               lVar13,0x18);
    vStack_b1a0.m_value = vStack_b010.m_value;
    dStack_b198 = dStack_b008;
    pdStack_b1c0 = (PointerType)local_b030._0_8_;
    dStack_b1b8 = (double)local_b030._8_8_;
    local_b1b0 = pMStack_b020;
    vStack_b1a8.m_value = vStack_b018.m_value;
    pMStack_b220 = pMStack_b2d8;
    local_b1c8.m_matrix = &local_9560;
    vStack_b248.m_value = local_b300._0_8_;
    vStack_b240.m_value = local_b300._8_8_;
    peStack_b238 = (element_type *)sStack_b2f0.m_other;
    vStack_b230.m_value = (long)sStack_b2e8.m_other;
    local_b210.m_matrix = &local_8b20;
    vStack_b1e8.m_value = vStack_aee0.m_value;
    dStack_b1e0 = dStack_aed8;
    pdStack_b208 = (PointerType)local_af00._0_8_;
    dStack_b200 = (double)local_af00._8_8_;
    local_b1f8 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_aef0.m_other;
    vStack_b1f0.m_value = (long)sStack_aee8.m_other;
    LStack_b250.m_matrix = (non_const_type)local_8b80;
    Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false> *)(local_8c20 + 0x70),
               &local_a220,lVar13,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>>
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false> *)(local_8c20 + 0x70),
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>
                *)local_b260);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_af98,xpr,
               lVar13,0);
    vStack_b2e0.m_value = vStack_af78.m_value;
    pMStack_b2d8 = pMStack_af70;
    local_b300._0_8_ = local_af98._0_8_;
    local_b300._8_8_ = local_af98._8_8_;
    sStack_b2f0.m_other = sStack_af88.m_other;
    sStack_b2e8.m_other = (double)vStack_af80.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b060,xpr,
               lVar13,0xc);
    vStack_aee0.m_value = vStack_b040.m_value;
    dStack_aed8 = dStack_b038;
    local_af00._0_8_ = local_b060._0_8_;
    local_af00._8_8_ = local_b060._8_8_;
    sStack_aef0.m_other = (double)pMStack_b050;
    sStack_aee8.m_other = (double)vStack_b048.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_b030,xpr,
               lVar13,0x18);
    LStack_b250.m_matrix = (non_const_type)local_8c20;
    vStack_b1a0.m_value = vStack_b010.m_value;
    dStack_b198 = dStack_b008;
    pdStack_b1c0 = (PointerType)local_b030._0_8_;
    dStack_b1b8 = (double)local_b030._8_8_;
    local_b1b0 = pMStack_b020;
    vStack_b1a8.m_value = vStack_b018.m_value;
    pMStack_b220 = pMStack_b2d8;
    vStack_b248.m_value = local_b300._0_8_;
    vStack_b240.m_value = local_b300._8_8_;
    peStack_b238 = (element_type *)sStack_b2f0.m_other;
    vStack_b230.m_value = (long)sStack_b2e8.m_other;
    local_b210.m_matrix = &local_9560;
    local_b1c8.m_matrix = &local_9500;
    vStack_b1e8.m_value = vStack_aee0.m_value;
    dStack_b1e0 = dStack_aed8;
    pdStack_b208 = (PointerType)local_af00._0_8_;
    dStack_b200 = (double)local_af00._8_8_;
    local_b1f8 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_aef0.m_other;
    vStack_b1f0.m_value = (long)sStack_aee8.m_other;
    Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false> *)(local_8c20 + 0x70),
               &local_a220,lVar13,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>>
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_12,_false> *)(local_8c20 + 0x70),
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>
                *)local_b260);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b300,xpr,lVar13
               ,0x24);
    local_b260._0_8_ = local_a6a0;
    peStack_b238 = (element_type *)vStack_b2e0.m_value;
    vStack_b230.m_value = (long)pMStack_b2d8;
    local_b260._8_8_ = local_b300._0_8_;
    LStack_b250.m_matrix = (non_const_type)local_b300._8_8_;
    vStack_b248.m_value = (long)sStack_b2f0.m_other;
    vStack_b240.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false> *)local_af00,&local_a220,
               lVar13,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const>>
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false> *)local_af00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>_>
                *)local_b260);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b300,xpr,lVar13
               ,0x27);
    local_b260._0_8_ = local_a6b8;
    peStack_b238 = (element_type *)vStack_b2e0.m_value;
    vStack_b230.m_value = (long)pMStack_b2d8;
    local_b260._8_8_ = local_b300._0_8_;
    LStack_b250.m_matrix = (non_const_type)local_b300._8_8_;
    vStack_b248.m_value = (long)sStack_b2f0.m_other;
    vStack_b240.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false> *)local_af00,&local_a220,
               lVar13,0x27);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const>>
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false> *)local_af00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>_>
                *)local_b260);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_b300,xpr,lVar13
               ,0x2a);
    local_b260._0_8_ = local_a6d0;
    peStack_b238 = (element_type *)vStack_b2e0.m_value;
    vStack_b230.m_value = (long)pMStack_b2d8;
    local_b260._8_8_ = local_b300._0_8_;
    LStack_b250.m_matrix = (non_const_type)local_b300._8_8_;
    vStack_b248.m_value = (long)sStack_b2f0.m_other;
    vStack_b240.m_value = (long)sStack_b2e8.m_other;
    Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false> *)local_af00,&local_a220,
               lVar13,0x2a);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,45,1,9,45>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const>>
              ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_3,_false> *)local_af00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>_>
                *)local_b260);
  }
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_1,_0,_45,_1>_>,_const_Eigen::Matrix<double,_45,_1,_0,_45,_1>_>
                    *)local_b300,&local_afe8,(StorageBaseType *)&this->m_MassMatrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,45,1,0,45,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,45,1,0,45,1>const>const,Eigen::Matrix<double,45,1,0,45,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,45,1,0,45,1>> *)local_b260,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_1,_0,_45,_1>_>,_const_Eigen::Matrix<double,_45,_1,_0,_45,_1>_>_>
              *)local_b300);
  lVar16 = 0;
  uVar4 = 0;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    row = lVar13 * 3 + 1;
    row_00 = lVar13 * 3 + 2;
    local_b370 = lVar13;
    for (lVar15 = 0; col = lVar16 + lVar15, col != 0x1b; lVar15 = lVar15 + 3) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_af98,xpr,
                 lVar13);
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)local_af00,&local_b068,(StorageBaseType *)local_af98);
      Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>::Block
                ((Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true> *)local_b030,
                 &local_a220,local_b370);
      vStack_b040.m_value = vStack_b010.m_value;
      dStack_b038 = dStack_b008;
      local_b060._0_8_ = local_b030._0_8_;
      local_b060._8_8_ = local_b030._8_8_;
      pMStack_b050 = pMStack_b020;
      vStack_b048.m_value = vStack_b018.m_value;
      Eigen::
      Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>,_0>
      ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_45,_1,_9,_45>,_1,_45,_true>_>,_0>
                 *)local_b300,
                (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                 *)local_af00,(Rhs *)local_b060);
      SVar17 = Eigen::internal::dense_product_base::operator_cast_to_double
                         ((dense_product_base *)local_b300);
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>,_1> *)local_b260,
                           (ulong)uVar4);
      this_00 = local_b070;
      dVar6 = SVar17 + *pSVar11;
      pSVar12 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::operator()(local_b070,lVar13 * 3,col);
      col_00 = lVar16 + 1 + lVar15;
      *pSVar12 = dVar6 + *pSVar12;
      pSVar12 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::operator()(this_00,row,col_00);
      col_01 = lVar16 + 2 + lVar15;
      *pSVar12 = dVar6 + *pSVar12;
      pSVar12 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::operator()(this_00,row_00,col_01);
      *pSVar12 = dVar6 + *pSVar12;
      if (lVar15 != 0) {
        pSVar12 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()(this_00,col,lVar13 * 3);
        *pSVar12 = dVar6 + *pSVar12;
        pSVar12 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()(this_00,col_00,row);
        *pSVar12 = dVar6 + *pSVar12;
        pSVar12 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()(this_00,col_01,row_00);
        *pSVar12 = dVar6 + *pSVar12;
      }
      uVar4 = uVar4 + 1;
      local_b370 = local_b370 + 1;
    }
    lVar16 = lVar16 + 3;
  }
  return;
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalJacobianContIntDamping(ChMatrixRef& H,
                                                                   double Kfactor,
                                                                   double Rfactor,
                                                                   double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For this element, this is likely more efficient than the "Pre-Integration" style
    // calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
    // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
    // up the generalized internal force calculation while only having a minimal impact on the performance of the
    // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
    // calculation of the potentially non-symmetric and non-sparse component.  The second piece is the symmetric
    // and sparse component.

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    //==============================================================================
    //==============================================================================
    // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
    // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
    // time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP_D0'...
    //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP_D0'...
    //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP_D0'...
    //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP_D0'...
    //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP_D0'...
    //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP_D0'...
    //       (d epsilon1/d e)GQPntDv1' ... (d epsilon1/d e)GQPntNIP_Dv'...
    //       (d epsilon2/d e)GQPntDv1' ... (d epsilon2/d e)GQPntNIP_Dv'...
    //       (d epsilon3/d e)GQPntDv1' ... (d epsilon3/d e)GQPntNIP_Dv']
    // Note that each partial derivative block shown is placed to the left of the previous block.
    // The explanation of the calculation above is just too long to write it all on a single line.
    // Since there are no shear terms with the material assumption for Dv, there is no need to calculate
    // (d epsilon4/d e), (d epsilon5/d e), (d epsilon6/d e) for the Dv Gauss points since these partial
    // derivatives will be multiplied by zero and will not contribute anything to the Jacobian matrix.
    // The calculation is performed on 3 rows at a time to capture the partial with respect to the vector of nodal
    // coordinates e while using the compact matrix form ebar for the calculations.
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 6 * NIP_D0 + 3 * NIP_Dv> PE;

    for (auto i = 0; i < NSF; i++) {
        PE.template block<1, NIP_D0>(3 * i, 0 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 1 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose());

        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 0 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0 * NIP_Dv, 0).transpose());
        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 1 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 1 * NIP_Dv, 0).transpose());
        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).transpose());

        PE.template block<1, NIP_D0>((3 * i) + 1, 0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose());

        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).transpose());

        PE.template block<1, NIP_D0>((3 * i) + 2, 0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose());

        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).transpose());
    }

    // =============================================================================
    // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
    // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
    // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
    // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
    // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
    // indices of the components are in transposed order
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks] <- D0
    // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks] <- D0
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks] <- D0
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks] <- Dv
    //            [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks] <- Dv
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks] <- Dv
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                               (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

    for (auto i = 0; i < 3; i++) {
        FCscaled.template block<NIP_D0, 1>(0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_D0, 1>(NIP_D0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, i).array() *= m_kGQ_Dv.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, i).array() *= m_kGQ_Dv.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, i).array() *= m_kGQ_Dv.array();
    }

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (do not include the Poisson effect
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
    // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
    // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
    // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
    // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
    // same time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // =============================================================================
    // For the D0 Gauss quadrature points, the stiffness matrix D0 is diagonal so the scaled partial derivatives can be
    // easily multiplied by D0.  The Dv Gauss quadrature points are handled separately after this
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 6 * NIP_D0 + 3 * NIP_Dv> DScaled_Combined_PE;

    for (auto i = 0; i < NSF; i++) {
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose()));

        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose()));

        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose()));
    }

    // =============================================================================
    // For the Dv Gauss quadrature points, the matrix of scaled partial derivatives needs to be calculated first since
    // they will be will be combined together when multiplying by the Dv stiffness matrix (upper 3x3 block is
    // potentially non-zero)
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 3 * NIP_Dv> Scaled_Combined_PE_Dv;

    for (auto i = 0; i < NSF; i++) {
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).transpose());

        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).transpose());

        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).transpose());
    }

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // For the Dv Gauss quadrature points, multiply the scaled and combined partial derivative block matrix by the
    // stiffness matrix for each individual Gauss quadrature point and place the results in th last 3*NIP_Dv columns of
    // the final scaled and combined partial derivative block matrix since the D0 Gauss quadrature point columns were
    // calculated above.
    // =============================================================================

    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + 0) =
        Dv(0, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(0, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(0, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);
    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + NIP_Dv) =
        Dv(1, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(1, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(1, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);
    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + 2 * NIP_Dv) =
        Dv(2, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(2, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(2, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);

    // =============================================================================
    // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
    // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
    // =============================================================================

    H = PE * DScaled_Combined_PE.transpose();

    //==============================================================================
    //==============================================================================
    // Calculate the sparse and symmetric component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // =============================================================================
    // For the D0 Gauss quadrature points:
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff stress can be
    // calculated by simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding
    // diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // For the Dv Gauss quadrature points:
    // Since only the upper 3x3 terms in the 6x6 stiffness matrix are used, only the E11, E22, and E33 components of the
    // Green-Lagrange strain tensor (combined and scaled) are needed since multiplying by the Dv stiffness matrix will
    // result in 2nd Piola-Kirchoff stresses that are only possibly non-zero for SPK2_11, SPK2_22, and SPK2_33. Results
    // are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Dv Gauss quadrature points.
    // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
    // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
    // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    //  where SPK2_23, SPK2_13, and SPK2_12 are zeros for the Dv Gauss quadrature points
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
    // quadrature point
    // =============================================================================

    ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

    for (auto i = 0; i < NSF; i++) {
        S_scaled_SD.template block<1, NIP_D0>(i, 0) =
            SPK2_1_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_6_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_5_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_D0>(i, NIP_D0) =
            SPK2_6_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_2_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_4_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_D0>(i, 2 * NIP_D0) =
            SPK2_5_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_4_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_3_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0) =
            SPK2_1_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + NIP_Dv) =
            SPK2_2_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv) =
            SPK2_3_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv));
    }

    // =============================================================================
    // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
    // matrix, combine this with the scaled mass matrix, and then expand them out to full size by summing the
    // contribution into the correct locations of the full sized Jacobian matrix
    // =============================================================================

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            double d = Kfactor * m_SD.row(i) * S_scaled_SD.row(j).transpose();
            d += ScaledMassMatrix(idx);

            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
            if (i != j) {
                H(3 * j, 3 * i) += d;
                H(3 * j + 1, 3 * i + 1) += d;
                H(3 * j + 2, 3 * i + 2) += d;
            }
            idx++;
        }
    }
}